

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routines.c
# Opt level: O3

void routine_register(routine *r)

{
  ulong uVar1;
  
  if (((r != (routine *)0x0) && (r->name != (char *)0x0)) && (r->desc != (char *)0x0)) {
    uVar1 = (ulong)routine_cnt;
    if (uVar1 < 0x100) {
      routine_cnt = routine_cnt + 1;
      routines[uVar1] = r;
      return;
    }
  }
  abort();
}

Assistant:

void
routine_register(const struct routine *r)
{
	if (!r)
		abort();
	if (!r->name)
		abort();
	if (!r->desc)
		abort();
	if (routine_cnt >= ROUTINES_MAX)
		abort();
	routines[routine_cnt++] = r;
}